

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

int lj_record_mm_lookup(jit_State *J,RecordIndex *ix,MMS mm)

{
  GCobj *o;
  short sVar1;
  IRRef1 IVar2;
  uint k;
  TRef TVar3;
  TRef TVar4;
  cTValue *pcVar5;
  IRType t;
  TRef local_270;
  uint local_26c;
  uint local_25c;
  cTValue *mo_1;
  GCstr *mmstr;
  TRef tr;
  cTValue *mo;
  GCtab *pGStack_208;
  int udtype;
  GCtab *mt;
  RecordIndex mix;
  MMS mm_local;
  RecordIndex *ix_local;
  jit_State *J_local;
  
  mix.idxchain = mm;
  if ((ix->tab & 0x1f000000) == 0xb000000) {
    pGStack_208 = *(GCtab **)(((ix->tabv).u64 & 0x7fffffffffff) + 0x20);
    TVar4 = ix->tab;
    (J->fold).ins.field_0.ot = 0x450b;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = 5;
    mix.oldv._0_4_ = lj_opt_fold(J);
  }
  else {
    if ((ix->tab & 0x1f000000) != 0xc000000) {
      if ((uint)((int)(ix->tabv).field_4.it >> 0xf) < 0xfffffff3) {
        local_25c = 0xd;
      }
      else {
        local_25c = (int)(ix->tabv).field_4.it >> 0xf ^ 0xffffffff;
      }
      pGStack_208 = *(GCtab **)((long)J + (ulong)(local_25c + 0x16) * 8 + -0x130);
      if (pGStack_208 == (GCtab *)0x0) {
        ix->mt = 0x7fff;
        return 0;
      }
      if ((ix->tab & 0x1f000000) == 0xa000000) {
LAB_00193478:
        pcVar5 = lj_tab_getstr(pGStack_208,
                               *(GCstr **)((long)J + (ulong)(uint)mix.idxchain * 8 + -0x130));
        if ((pcVar5 == (cTValue *)0x0) || (pcVar5->u64 == 0xffffffffffffffff)) {
          return 0;
        }
        if (((int)(pcVar5->field_4).it >> 0xf != -9) && ((int)(pcVar5->field_4).it >> 0xf != -0xc))
        {
          lj_trace_err(J,LJ_TRERR_BADTYPE);
        }
        (ix->mobjv).field_4 = *(anon_struct_8_2_7fa0a05d_for_TValue_4 *)pcVar5;
        t = IRT_TAB;
        if ((int)(pcVar5->field_4).it >> 0xf == -9) {
          t = IRT_FUNC;
        }
        TVar4 = lj_ir_kgc(J,(GCobj *)(pcVar5->u64 & 0x7fffffffffff),t);
        ix->mobj = TVar4;
        ix->mtv = pGStack_208;
        ix->mt = 0x7fff;
        return 1;
      }
      if ((uint)((int)(ix->tabv).field_4.it >> 0xf) < 0xfffffff3) {
        local_26c = 0xd;
      }
      else {
        local_26c = (int)(ix->tabv).field_4.it >> 0xf ^ 0xffffffff;
      }
      mix.oldv._0_4_ = lj_ir_ggfload(J,IRT_TAB,(long)(int)((local_26c + 0x16) * 8 + 0x208));
      ix->mt = (TRef)mix.oldv;
      goto LAB_001938b6;
    }
    k = (uint)*(byte *)(((ix->tabv).u64 & 0x7fffffffffff) + 10);
    pGStack_208 = *(GCtab **)(((ix->tabv).u64 & 0x7fffffffffff) + 0x20);
    if (k != 0) {
      if (k == 2) {
        TVar4 = ix->tab;
        TVar3 = lj_ir_kptr_(J,IR_KPTR,(void *)((ix->tabv).u64 & 0x7fffffffffff));
        (J->fold).ins.field_0.ot = 0x889;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
        lj_opt_fold(J);
      }
      else {
        TVar4 = ix->tab;
        (J->fold).ins.field_0.ot = 0x4510;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = 0xc;
        TVar4 = lj_opt_fold(J);
        TVar3 = lj_ir_kint(J,k);
        (J->fold).ins.field_0.ot = 0x893;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
        lj_opt_fold(J);
      }
      goto LAB_00193478;
    }
    TVar4 = ix->tab;
    (J->fold).ins.field_0.ot = 0x450b;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = 0xb;
    mix.oldv._0_4_ = lj_opt_fold(J);
  }
  if (pGStack_208 == (GCtab *)0x0) {
    local_270 = 0x7fff;
  }
  else {
    local_270 = (TRef)mix.oldv;
  }
  ix->mt = local_270;
  sVar1 = 8;
  if (pGStack_208 != (GCtab *)0x0) {
    sVar1 = 9;
  }
  IVar2 = (IRRef1)(TRef)mix.oldv;
  TVar4 = lj_ir_knull(J,IRT_TAB);
  (J->fold).ins.field_0.ot = sVar1 << 8 | 0x8b;
  (J->fold).ins.field_0.op1 = IVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
  lj_opt_fold(J);
LAB_001938b6:
  if (pGStack_208 == (GCtab *)0x0) {
    J_local._4_4_ = 0;
  }
  else {
    o = *(GCobj **)((long)J + (ulong)(uint)mix.idxchain * 8 + -0x130);
    pcVar5 = lj_tab_getstr(pGStack_208,&o->str);
    if ((pcVar5 != (cTValue *)0x0) && (pcVar5->u64 != 0xffffffffffffffff)) {
      ix->mobjv = *pcVar5;
    }
    ix->mtv = pGStack_208;
    mt = (GCtab *)((ulong)pGStack_208 | 0xfffa000000000000);
    mix.tabv.u64 = (ulong)o | 0xfffd800000000000;
    mix.oldv._4_4_ = lj_ir_kgc(J,o,IRT_STR);
    mix.tab = 0;
    mix.mt = 0;
    TVar4 = lj_record_idx(J,(RecordIndex *)&mt);
    ix->mobj = TVar4;
    J_local._4_4_ = (uint)(((ix->mobj & 0x1f000000) == 0 ^ 0xffU) & 1);
  }
  return J_local._4_4_;
}

Assistant:

int lj_record_mm_lookup(jit_State *J, RecordIndex *ix, MMS mm)
{
  RecordIndex mix;
  GCtab *mt;
  if (tref_istab(ix->tab)) {
    mt = tabref(tabV(&ix->tabv)->metatable);
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
  } else if (tref_isudata(ix->tab)) {
    int udtype = udataV(&ix->tabv)->udtype;
    mt = tabref(udataV(&ix->tabv)->metatable);
    /* The metatables of special userdata objects are treated as immutable. */
    if (udtype != UDTYPE_USERDATA) {
      cTValue *mo;
      if (LJ_HASFFI && udtype == UDTYPE_FFI_CLIB) {
	/* Specialize to the C library namespace object. */
	emitir(IRTG(IR_EQ, IRT_PGC), ix->tab, lj_ir_kptr(J, udataV(&ix->tabv)));
      } else {
	/* Specialize to the type of userdata. */
	TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), ix->tab, IRFL_UDATA_UDTYPE);
	emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, udtype));
      }
  immutable_mt:
      mo = lj_tab_getstr(mt, mmname_str(J2G(J), mm));
      if (!mo || tvisnil(mo))
	return 0;  /* No metamethod. */
      /* Treat metamethod or index table as immutable, too. */
      if (!(tvisfunc(mo) || tvistab(mo)))
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      copyTV(J->L, &ix->mobjv, mo);
      ix->mobj = lj_ir_kgc(J, gcV(mo), tvisfunc(mo) ? IRT_FUNC : IRT_TAB);
      ix->mtv = mt;
      ix->mt = TREF_NIL;  /* Dummy value for comparison semantics. */
      return 1;  /* Got metamethod or index table. */
    }
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_UDATA_META);
  } else {
    /* Specialize to base metatable. Must flush mcode in lua_setmetatable(). */
    mt = tabref(basemt_obj(J2G(J), &ix->tabv));
    if (mt == NULL) {
      ix->mt = TREF_NIL;
      return 0;  /* No metamethod. */
    }
    /* The cdata metatable is treated as immutable. */
    if (LJ_HASFFI && tref_iscdata(ix->tab)) goto immutable_mt;
    ix->mt = mix.tab = lj_ir_ggfload(J, IRT_TAB,
      GG_OFS(g.gcroot[GCROOT_BASEMT+itypemap(&ix->tabv)]));
    goto nocheck;
  }
  ix->mt = mt ? mix.tab : TREF_NIL;
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mix.tab, lj_ir_knull(J, IRT_TAB));
nocheck:
  if (mt) {
    GCstr *mmstr = mmname_str(J2G(J), mm);
    cTValue *mo = lj_tab_getstr(mt, mmstr);
    if (mo && !tvisnil(mo))
      copyTV(J->L, &ix->mobjv, mo);
    ix->mtv = mt;
    settabV(J->L, &mix.tabv, mt);
    setstrV(J->L, &mix.keyv, mmstr);
    mix.key = lj_ir_kstr(J, mmstr);
    mix.val = 0;
    mix.idxchain = 0;
    ix->mobj = lj_record_idx(J, &mix);
    return !tref_isnil(ix->mobj);  /* 1 if metamethod found, 0 if not. */
  }
  return 0;  /* No metamethod. */
}